

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# texture2.c
# Opt level: O0

ktx_error_code_e ktxTexture2_SetTransferFunction(ktxTexture2 *This,khr_df_transfer_e tf)

{
  _Bool _Var1;
  uint in_ESI;
  long in_RDI;
  ktx_error_code_e local_4;
  
  _Var1 = isSrgbFormat(*(VkFormat *)(in_RDI + 0x78));
  if ((_Var1) && (in_ESI != 2)) {
    local_4 = KTX_INVALID_OPERATION;
  }
  else {
    _Var1 = isNotSrgbFormatButHasSrgbVariant(*(VkFormat *)(in_RDI + 0x78));
    if ((_Var1) && (in_ESI == 2)) {
      local_4 = KTX_INVALID_OPERATION;
    }
    else {
      *(uint *)(*(long *)(in_RDI + 0x80) + 0xc) =
           *(uint *)(*(long *)(in_RDI + 0x80) + 0xc) & 0xff00ffff | (in_ESI & 0xff) << 0x10;
      local_4 = KTX_SUCCESS;
    }
  }
  return local_4;
}

Assistant:

ktx_error_code_e
ktxTexture2_SetTransferFunction(ktxTexture2* This, khr_df_transfer_e tf)
{
    if (isSrgbFormat(This->vkFormat) && tf != KHR_DF_TRANSFER_SRGB)
        return KTX_INVALID_OPERATION;

    if (isNotSrgbFormatButHasSrgbVariant(This->vkFormat) && tf == KHR_DF_TRANSFER_SRGB)
        return KTX_INVALID_OPERATION;

    KHR_DFDSETVAL(This->pDfd + 1, TRANSFER, tf);
    return KTX_SUCCESS;
}